

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.h
# Opt level: O3

void __thiscall cmExportFileGenerator::~cmExportFileGenerator(cmExportFileGenerator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_cmExportFileGenerator = (_func_int **)&PTR__cmExportFileGenerator_005a95d0;
  std::
  _Rb_tree<cmTarget_*,_cmTarget_*,_std::_Identity<cmTarget_*>,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>
  ::~_Rb_tree(&(this->ExportedTargets)._M_t);
  pcVar1 = (this->FileExt)._M_dataplus._M_p;
  paVar2 = &(this->FileExt).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->FileBase)._M_dataplus._M_p;
  paVar2 = &(this->FileBase).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->FileDir)._M_dataplus._M_p;
  paVar2 = &(this->FileDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->MainImportFile)._M_dataplus._M_p;
  paVar2 = &(this->MainImportFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Configurations);
  pcVar1 = (this->Namespace)._M_dataplus._M_p;
  paVar2 = &(this->Namespace).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~cmExportFileGenerator() {}